

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mctools_impl_error(char *msg)

{
  fprintf(_stderr,"%s\n",msg);
  exit(1);
}

Assistant:

void mctools_impl_error( const char * msg )
    {
#ifdef __cplusplus
      throw std::runtime_error(msg);
#else
      fprintf(stderr, "%s\n",msg);
      exit(EXIT_FAILURE);
#endif
    }